

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O0

int mbedtls_asn1_get_len(uchar **p,uchar *end,size_t *len)

{
  byte *pbVar1;
  uint local_2c;
  int n;
  size_t *len_local;
  uchar *end_local;
  uchar **p_local;
  
  if ((long)end - (long)*p < 1) {
    return -0x60;
  }
  if ((**p & 0x80) == 0) {
    pbVar1 = *p;
    *p = pbVar1 + 1;
    *len = (ulong)*pbVar1;
  }
  else {
    local_2c = **p & 0x7f;
    if (((**p & 0x7f) == 0) || (4 < local_2c)) {
      return -100;
    }
    if ((long)end - (long)*p <= (long)(int)local_2c) {
      return -0x60;
    }
    *len = 0;
    *p = *p + 1;
    while (local_2c != 0) {
      *len = *len << 8 | (ulong)**p;
      *p = *p + 1;
      local_2c = local_2c - 1;
    }
  }
  if ((ulong)((long)end - (long)*p) < *len) {
    p_local._4_4_ = -0x60;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_get_len(unsigned char **p,
                         const unsigned char *end,
                         size_t *len)
{
    if ((end - *p) < 1) {
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }

    if ((**p & 0x80) == 0) {
        *len = *(*p)++;
    } else {
        int n = (**p) & 0x7F;
        if (n == 0 || n > 4) {
            return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
        }
        if ((end - *p) <= n) {
            return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
        }
        *len = 0;
        (*p)++;
        while (n--) {
            *len = (*len << 8) | **p;
            (*p)++;
        }
    }

    if (*len > (size_t) (end - *p)) {
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }

    return 0;
}